

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

first_of_any_result __thiscall
c4::basic_substring<char_const>::first_of_any_iter<c4::basic_substring<char_const>*>
          (basic_substring<char_const> *this,basic_substring<const_char> *first_span,
          basic_substring<const_char> *last_span)

{
  char *pcVar1;
  char *pcVar2;
  code *pcVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  basic_substring<const_char> *pbVar7;
  first_of_any_result fVar8;
  ulong uStack_50;
  
  for (uStack_50 = 0; uStack_50 < *(ulong *)(this + 8); uStack_50 = uStack_50 + 1) {
    uVar5 = 0;
    for (pbVar7 = first_span; pbVar7 != last_span; pbVar7 = pbVar7 + 1) {
      if (pbVar7->len + uStack_50 <= *(ulong *)(this + 8)) {
        uVar6 = 0;
        do {
          if (pbVar7->len <= uVar6) goto LAB_001e0d28;
          if (*(ulong *)(this + 8) <= uStack_50 + uVar6) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
              pcVar3 = (code *)swi(3);
              fVar8 = (first_of_any_result)(*pcVar3)();
              return fVar8;
            }
            handle_error(0x1ea013,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x167a,"i + j < len");
          }
          pcVar2 = (char *)(uVar6 + *(long *)this + uStack_50);
          if (pbVar7->len <= uVar6) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
              pcVar3 = (code *)swi(3);
              fVar8 = (first_of_any_result)(*pcVar3)();
              return fVar8;
            }
            handle_error(0x1ea013,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x14c4,"i >= 0 && i < len");
          }
          pcVar1 = pbVar7->str + uVar6;
          uVar6 = uVar6 + 1;
        } while (*pcVar2 == *pcVar1);
      }
      uVar5 = uVar5 + 1;
    }
  }
  uStack_50 = 0xffffffffffffffff;
  uVar5 = uStack_50;
LAB_001e0d28:
  fVar8.pos = uStack_50;
  fVar8.which = uVar5;
  return fVar8;
}

Assistant:

first_of_any_result first_of_any_iter(It first_span, It last_span) const
    {
        for(size_t i = 0; i < len; ++i)
        {
            size_t curr = 0;
            for(It it = first_span; it != last_span; ++curr, ++it)
            {
                auto const& chars = *it;
                if((i + chars.len) > len) continue;
                bool gotit = true;
                for(size_t j = 0; j < chars.len; ++j)
                {
                    C4_ASSERT(i + j < len);
                    if(str[i + j] != chars[j])
                    {
                        gotit = false;
                        break;
                    }
                }
                if(gotit)
                {
                    return {curr, i};
                }
            }
        }
        return {NONE, npos};
    }